

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

Index __thiscall
MADPComponentDiscreteObservations::IndividualToJointObservationIndices
          (MADPComponentDiscreteObservations *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivObservationIndices)

{
  Index IVar1;
  ostream *poVar2;
  E *this_00;
  stringstream *arg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index i;
  stringstream ss;
  size_t *in_stack_fffffffffffffe48;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if (((ulong)(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,
                             "MADPComponentDiscreteObservations::GetJointObservationIndex(");
    this_00 = (E *)std::operator<<(poVar2,
                                   "vector<Index>& indivObservationIndices) - Error: not initialized."
                                  );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    arg = (stringstream *)__cxa_allocate_exception(0x28);
    E::E(this_00,arg);
    __cxa_throw(arg,&E::typeinfo,E::~E);
  }
  IVar1 = IndexTools::IndividualToJointIndicesStepSize(in_RDI,in_stack_fffffffffffffe48);
  return IVar1;
}

Assistant:

Index MADPComponentDiscreteObservations::IndividualToJointObservationIndices(
    const vector<Index>& indivObservationIndices)const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss <<  "MADPComponentDiscreteObservations::GetJointObservationIndex("<<
           "vector<Index>& indivObservationIndices) - Error: not initialized."
            <<endl;
        throw E(ss);
    }
    Index i = IndexTools::IndividualToJointIndicesStepSize(
            indivObservationIndices, _m_observationStepSize);

    return(i);
}